

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3GenerateIndexKey
              (Parse *pParse,Index *pIdx,int iDataCur,int regOut,int prefixOnly,int *piPartIdxLabel,
              Index *pPrior,int regPrior)

{
  ushort uVar1;
  Vdbe *p;
  short sVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  char *zP4;
  uint nReg;
  uint addr;
  int *piVar6;
  ulong uVar7;
  
  p = pParse->pVdbe;
  if (piPartIdxLabel != (int *)0x0) {
    piVar6 = piPartIdxLabel;
    if (pIdx->pPartIdxWhere != (Expr *)0x0) {
      iVar4 = regOut;
      iVar3 = sqlite3VdbeMakeLabel((Vdbe *)p->pParse);
      *piPartIdxLabel = iVar3;
      pParse->iSelfTab = iDataCur + 1;
      pParse->iCacheLevel = pParse->iCacheLevel + 1;
      piVar6 = &pParse->iSelfTab;
      sqlite3ExprIfFalseDup(pParse,pIdx->pPartIdxWhere,*piPartIdxLabel,iVar4);
    }
    *piVar6 = 0;
  }
  if ((prefixOnly == 0) || (lVar5 = 0x5e, (pIdx->field_0x63 & 8) == 0)) {
    lVar5 = 0x60;
  }
  uVar1 = *(ushort *)((long)&pIdx->zName + lVar5);
  nReg = (uint)uVar1;
  iVar4 = sqlite3GetTempRange(pParse,nReg);
  if (((pPrior == (Index *)0x0) || (iVar4 != regPrior)) || (pPrior->pPartIdxWhere != (Expr *)0x0)) {
    pPrior = (Index *)0x0;
  }
  if (uVar1 != 0) {
    lVar5 = 8;
    uVar7 = 0;
    do {
      if (pPrior == (Index *)0x0) {
        sVar2 = pIdx->aiColumn[uVar7];
LAB_00165336:
        if (sVar2 == -2) {
          pParse->iSelfTab = iDataCur + 1;
          sqlite3ExprCodeCopy(pParse,*(Expr **)((long)pIdx->aColExpr->a + lVar5 + -8),
                              iVar4 + (int)uVar7);
          pParse->iSelfTab = 0;
        }
        else {
          sqlite3ExprCodeGetColumnOfTable
                    (pParse->pVdbe,pIdx->pTable,iDataCur,(int)sVar2,iVar4 + (int)uVar7);
        }
        if ((0 < p->nOp) && (addr = p->nOp - 1, p->aOp[addr].opcode == 'H')) {
          sqlite3VdbeChangeToNoop(p,addr);
        }
      }
      else {
        sVar2 = pIdx->aiColumn[uVar7];
        if ((pPrior->aiColumn[uVar7] == -2) || (pPrior->aiColumn[uVar7] != sVar2))
        goto LAB_00165336;
      }
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + 0x20;
    } while (nReg != uVar7);
  }
  if ((regOut != 0) &&
     (sqlite3VdbeAddOp3(p,99,iVar4,nReg,regOut), pIdx->pTable->pSelect != (Select *)0x0)) {
    zP4 = sqlite3IndexAffinityStr(pParse->db,pIdx);
    sqlite3VdbeChangeP4(p,-1,zP4,0);
  }
  sqlite3ReleaseTempRange(pParse,iVar4,nReg);
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3GenerateIndexKey(
  Parse *pParse,       /* Parsing context */
  Index *pIdx,         /* The index for which to generate a key */
  int iDataCur,        /* Cursor number from which to take column data */
  int regOut,          /* Put the new key into this register if not 0 */
  int prefixOnly,      /* Compute only a unique prefix of the key */
  int *piPartIdxLabel, /* OUT: Jump to this label to skip partial index */
  Index *pPrior,       /* Previously generated index key */
  int regPrior         /* Register holding previous generated key */
){
  Vdbe *v = pParse->pVdbe;
  int j;
  int regBase;
  int nCol;

  if( piPartIdxLabel ){
    if( pIdx->pPartIdxWhere ){
      *piPartIdxLabel = sqlite3VdbeMakeLabel(v);
      pParse->iSelfTab = iDataCur + 1;
      sqlite3ExprCachePush(pParse);
      sqlite3ExprIfFalseDup(pParse, pIdx->pPartIdxWhere, *piPartIdxLabel, 
                            SQLITE_JUMPIFNULL);
      pParse->iSelfTab = 0;
    }else{
      *piPartIdxLabel = 0;
    }
  }
  nCol = (prefixOnly && pIdx->uniqNotNull) ? pIdx->nKeyCol : pIdx->nColumn;
  regBase = sqlite3GetTempRange(pParse, nCol);
  if( pPrior && (regBase!=regPrior || pPrior->pPartIdxWhere) ) pPrior = 0;
  for(j=0; j<nCol; j++){
    if( pPrior
     && pPrior->aiColumn[j]==pIdx->aiColumn[j]
     && pPrior->aiColumn[j]!=XN_EXPR
    ){
      /* This column was already computed by the previous index */
      continue;
    }
    sqlite3ExprCodeLoadIndexColumn(pParse, pIdx, iDataCur, j, regBase+j);
    /* If the column affinity is REAL but the number is an integer, then it
    ** might be stored in the table as an integer (using a compact
    ** representation) then converted to REAL by an OP_RealAffinity opcode.
    ** But we are getting ready to store this value back into an index, where
    ** it should be converted by to INTEGER again.  So omit the OP_RealAffinity
    ** opcode if it is present */
    sqlite3VdbeDeletePriorOpcode(v, OP_RealAffinity);
  }
  if( regOut ){
    sqlite3VdbeAddOp3(v, OP_MakeRecord, regBase, nCol, regOut);
    if( pIdx->pTable->pSelect ){
      const char *zAff = sqlite3IndexAffinityStr(pParse->db, pIdx);
      sqlite3VdbeChangeP4(v, -1, zAff, P4_TRANSIENT);
    }
  }
  sqlite3ReleaseTempRange(pParse, regBase, nCol);
  return regBase;
}